

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void get_mask_or_payload(cio_websocket *websocket,cio_buffered_stream *buffered_stream,
                        cio_read_buffer *buffer)

{
  cio_error err_00;
  cio_error err;
  cio_read_buffer *buffer_local;
  cio_buffered_stream *buffered_stream_local;
  cio_websocket *websocket_local;
  
  if ((*(ushort *)&(websocket->ws_private).ws_flags >> 10 & 1) == 1) {
    err_00 = cio_buffered_stream_read_at_least(buffered_stream,buffer,4,get_mask,websocket);
    if (err_00 != CIO_SUCCESS) {
      handle_error(websocket,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "error while start reading websocket mask");
    }
  }
  else {
    read_payload(websocket,buffered_stream,buffer);
  }
  return;
}

Assistant:

static void get_mask_or_payload(struct cio_websocket *websocket, struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer)
{
	if (websocket->ws_private.ws_flags.is_server == 1U) {
		enum cio_error err = cio_buffered_stream_read_at_least(buffered_stream, buffer, sizeof(websocket->ws_private.received_mask), get_mask, websocket);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket mask");
		}
	} else {
		read_payload(websocket, buffered_stream, buffer);
	}
}